

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void mouse_button_callback(GLFWwindow *window,int button,int action,int mods)

{
  float fVar1;
  
  if (action != 1) {
    return;
  }
  if (button == 0) {
    fVar1 = -0.1;
  }
  else {
    if (button != 1) goto LAB_0011b15c;
    fVar1 = 0.1;
  }
  zoom = fVar1 + zoom;
LAB_0011b15c:
  fVar1 = 0.1;
  if ((zoom < 0.1) || (fVar1 = 100.0, 100.0 < zoom)) {
    zoom = fVar1;
  }
  return;
}

Assistant:

void mouse_button_callback(GLFWwindow* window, int button, int action, int mods){
    if(action == GLFW_PRESS){
        switch(button){
            case GLFW_MOUSE_BUTTON_LEFT:
                zoom -= 0.1f;
                break;
            case GLFW_MOUSE_BUTTON_RIGHT:
                zoom += 0.1f;
            default:
                break;
        }
        if(zoom < 0.1f){
            zoom = 0.1f;
        } else if(zoom > 100.0f){
            zoom = 100.0f;
        }
    }
}